

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O2

void __thiscall basisu::etc_block::get_block_colors_etc1s(etc_block *this,color_rgba *pBlock_colors)

{
  int iVar1;
  uint16_t packed_color5;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 uStack_38;
  color_rgba b;
  
  uStack_38 = in_RAX;
  packed_color5 = get_base5_color(this);
  unpack_color5(&b,packed_color5,true);
  uVar6 = (ulong)((this->field_0).m_bytes[3] >> 1 & 0xfffffff0);
  iVar1 = *(int *)((long)&g_etc1_inten_tables + uVar6);
  uVar2 = (uint)b.field_0.m_comps[0] + iVar1;
  uVar5 = 0xff;
  if (uVar2 < 0xff) {
    uVar5 = uVar2;
  }
  uVar7 = 0;
  if ((int)uVar2 < 0) {
    uVar5 = uVar7;
  }
  uVar3 = (uint)b.field_0.m_comps[1] + iVar1;
  uVar2 = 0xff;
  if (uVar3 < 0xff) {
    uVar2 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar2 = uVar7;
  }
  uVar4 = (uint)b.field_0.m_comps[2] + iVar1;
  uVar3 = 0xff;
  if (uVar4 < 0xff) {
    uVar3 = uVar4;
  }
  iVar1 = *(int *)((long)&DAT_003099e4 + uVar6);
  if ((int)uVar4 < 0) {
    uVar3 = uVar7;
  }
  color_rgba::set(pBlock_colors,uVar5,uVar2,uVar3,0xff);
  uVar2 = (uint)b.field_0.m_comps[0] + iVar1;
  uVar5 = 0xff;
  if (uVar2 < 0xff) {
    uVar5 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar5 = uVar7;
  }
  uVar3 = (uint)b.field_0.m_comps[1] + iVar1;
  uVar2 = 0xff;
  if (uVar3 < 0xff) {
    uVar2 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar2 = uVar7;
  }
  uVar4 = (uint)b.field_0.m_comps[2] + iVar1;
  uVar3 = 0xff;
  if (uVar4 < 0xff) {
    uVar3 = uVar4;
  }
  if ((int)uVar4 < 0) {
    uVar3 = uVar7;
  }
  color_rgba::set(pBlock_colors + 1,uVar5,uVar2,uVar3,0xff);
  iVar1 = *(int *)(&DAT_003099e8 + uVar6);
  uVar2 = (uint)b.field_0.m_comps[0] + iVar1;
  uVar5 = 0xff;
  if (uVar2 < 0xff) {
    uVar5 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar5 = uVar7;
  }
  uVar3 = (uint)b.field_0.m_comps[1] + iVar1;
  uVar2 = 0xff;
  if (uVar3 < 0xff) {
    uVar2 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar2 = uVar7;
  }
  uVar4 = (uint)b.field_0.m_comps[2] + iVar1;
  uVar3 = 0xff;
  if (uVar4 < 0xff) {
    uVar3 = uVar4;
  }
  if ((int)uVar4 < 0) {
    uVar3 = uVar7;
  }
  color_rgba::set(pBlock_colors + 2,uVar5,uVar2,uVar3,0xff);
  iVar1 = *(int *)(&DAT_003099ec + uVar6);
  uVar2 = (uint)b.field_0.m_comps[0] + iVar1;
  uVar5 = 0xff;
  if (uVar2 < 0xff) {
    uVar5 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar5 = uVar7;
  }
  uVar3 = (uint)b.field_0.m_comps[1] + iVar1;
  uVar2 = 0xff;
  if (uVar3 < 0xff) {
    uVar2 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar2 = uVar7;
  }
  uVar3 = (uint)b.field_0.m_comps[2] + iVar1;
  uVar7 = 0xff;
  if (uVar3 < 0xff) {
    uVar7 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar7 = 0;
  }
  color_rgba::set(pBlock_colors + 3,uVar5,uVar2,uVar7,0xff);
  return;
}

Assistant:

void get_block_colors_etc1s(color_rgba* pBlock_colors) const
		{
			color_rgba b;

			unpack_color5(b, get_base5_color(), true);

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(0)];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}